

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::run(Session *this)

{
  type tVar1;
  unsigned_long *puVar2;
  Ptr<Catch::Config> *in_RDI;
  exception *ex;
  Option<unsigned_long> listed;
  Runner runner;
  Runner *in_stack_fffffffffffffd20;
  Session *in_stack_fffffffffffffd30;
  Runner *in_stack_fffffffffffffd50;
  int local_2a0;
  Option<unsigned_long> local_270 [4];
  Config *in_stack_fffffffffffffdd8;
  int local_4;
  
  if (((ulong)in_RDI[0x10].m_p & 0x100000000000000) == 0) {
    config(in_stack_fffffffffffffd30);
    srand(*(uint *)&in_RDI[0x12].m_p);
    Runner::Runner(in_stack_fffffffffffffd50,in_RDI);
    config(in_stack_fffffffffffffd30);
    list(in_stack_fffffffffffffdd8);
    tVar1 = Option::operator_cast_to_function_pointer((Option<unsigned_long> *)0x24c6f8);
    if (tVar1 != 0) {
      puVar2 = Option<unsigned_long>::operator*(local_270);
      local_4 = (int)*puVar2;
    }
    Option<unsigned_long>::~Option((Option<unsigned_long> *)0x24c795);
    if (tVar1 == 0) {
      Runner::runTests((Runner *)runner._392_8_);
      local_4 = local_2a0;
    }
    Runner::~Runner(in_stack_fffffffffffffd20);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed

                std::srand( m_configData.rngSeed );

                Runner runner( m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runner.runTests().assertions.failed );
            }
            catch( std::exception& ex ) {
                Catch::cerr() << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }